

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void slang::ast::ModportSymbol::fromSyntax
               (ASTContext *context,ModportDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::ModportSymbol_*> *results)

{
  TokenKind TVar1;
  SyntaxKind SVar2;
  size_type sVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  ArgumentDirection direction;
  ModportItemSyntax *pMVar4;
  ModportSymbol *this;
  Scope *pSVar5;
  AnsiPortListSyntax *pAVar6;
  MemberSyntax *this_00;
  ModportSimplePortListSyntax *pMVar7;
  SyntaxNode *pSVar8;
  ModportNamedPortSyntax *pMVar9;
  ModportPortSymbol *this_01;
  ModportExplicitPortSyntax *syntax_02;
  ModportSubroutinePortListSyntax *pMVar10;
  MethodPrototypeSymbol *this_02;
  ModportSubroutinePortSyntax *syntax_03;
  ModportClockingPortSyntax *syntax_04;
  ModportClockingSymbol *this_03;
  logic_error *plVar11;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> sVar12;
  allocator<char> local_171;
  ModportSymbol *modport;
  iterator __begin5;
  string_view local_150;
  iterator __begin3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  const_iterator __begin2;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong local_70;
  Compilation *local_68;
  SyntaxList *local_60;
  SmallVectorBase<const_slang::ast::ModportSymbol_*> *local_58;
  ParentList *local_50;
  ulong local_48;
  ParentList *local_40;
  ulong local_38;
  
  local_58 = results;
  local_68 = ASTContext::getCompilation(context);
  __begin2.list = &syntax->items;
  __begin2.index = 0;
  local_70 = (syntax->items).elements.size_ + 1 >> 1;
  local_60 = (SyntaxList *)&(syntax->super_MemberSyntax).attributes;
  local_50 = __begin2.list;
  for (; (__begin2.list != local_50 || (__begin2.index != local_70));
      __begin2.index = __begin2.index + 1) {
    pMVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::
             iterator_base<const_slang::syntax::ModportItemSyntax_*>::operator*(&__begin2);
    local_150 = parsing::Token::valueText(&pMVar4->name);
    local_120._M_dataplus._M_p = (pointer)parsing::Token::location(&pMVar4->name);
    this = BumpAllocator::
           emplace<slang::ast::ModportSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&local_68->super_BumpAllocator,local_68,&local_150,
                      (SourceLocation *)&local_120);
    (this->super_Symbol).originatingSyntax = &pMVar4->super_SyntaxNode;
    modport = this;
    pSVar5 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
    sVar12 = slang::syntax::SyntaxList::operator_cast_to_span(local_60);
    Symbol::setAttributes(&this->super_Symbol,pSVar5,sVar12);
    SmallVectorBase<slang::ast::ModportSymbol_const*>::
    emplace_back<slang::ast::ModportSymbol_const*const&>
              ((SmallVectorBase<slang::ast::ModportSymbol_const*> *)local_58,&modport);
    pAVar6 = not_null<slang::syntax::AnsiPortListSyntax_*>::get(&pMVar4->ports);
    __begin3.list = &pAVar6->ports;
    __begin3.index = 0;
    local_48 = (pAVar6->ports).elements.size_ + 1 >> 1;
    local_40 = __begin3.list;
    for (; (__begin3.list != local_40 || (__begin3.index != local_48));
        __begin3.index = __begin3.index + 1) {
      this_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::
                iterator_base<slang::syntax::MemberSyntax_*>::operator*(&__begin3);
      SVar2 = (this_00->super_SyntaxNode).kind;
      if (SVar2 == ModportClockingPort) {
        syntax_04 = slang::syntax::SyntaxNode::as<slang::syntax::ModportClockingPortSyntax>
                              (&this_00->super_SyntaxNode);
        this_03 = ModportClockingSymbol::fromSyntax(context,syntax_04);
        sVar12.data_ = (syntax_04->super_MemberSyntax).attributes.
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       data_;
        sVar12.size_ = (syntax_04->super_MemberSyntax).attributes.
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       size_;
        Symbol::setAttributes(&this_03->super_Symbol,&modport->super_Scope,sVar12);
        Scope::addMember(&modport->super_Scope,&this_03->super_Symbol);
      }
      else if (SVar2 == ModportSubroutinePortList) {
        pMVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSubroutinePortListSyntax>
                            (&this_00->super_SyntaxNode);
        TVar1 = (pMVar10->importExport).kind;
        if (TVar1 == ExportKeyword) {
          modport->hasExports = true;
        }
        __begin5.index = 0;
        local_38 = (pMVar10->ports).elements.size_ + 1 >> 1;
        __begin5.list = &pMVar10->ports;
        for (; (__begin5.list != &pMVar10->ports || (__begin5.index != local_38));
            __begin5.index = __begin5.index + 1) {
          pSVar8 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
                    iterator_base<slang::syntax::ModportPortSyntax_*>::operator*(&__begin5)->
                    super_SyntaxNode;
          if (pSVar8->kind == ModportSubroutinePort) {
            pSVar5 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
            syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSubroutinePortSyntax>
                                  (pSVar8);
            this_02 = MethodPrototypeSymbol::fromSyntax(pSVar5,syntax_03,TVar1 == ExportKeyword);
          }
          else {
            if (pSVar8->kind != ModportNamedPort) {
              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                         ,&local_171);
              std::operator+(&local_b0,&local_d0,":");
              std::__cxx11::to_string(&local_f0,0x173);
              std::operator+(&local_90,&local_b0,&local_f0);
              std::operator+(&local_120,&local_90,": ");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_150,&local_120,"Default case should be unreachable!");
              std::logic_error::logic_error(plVar11,(string *)&local_150);
              __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            pMVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ModportNamedPortSyntax>(pSVar8);
            this_02 = MethodPrototypeSymbol::fromSyntax(context,pMVar9,TVar1 == ExportKeyword);
          }
          syntax_01.data_ =
               (pMVar10->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
          syntax_01.size_ =
               (pMVar10->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
          Symbol::setAttributes(&this_02->super_Symbol,&modport->super_Scope,syntax_01);
          Scope::addMember(&modport->super_Scope,&this_02->super_Symbol);
        }
      }
      else {
        if (SVar2 != ModportSimplePortList) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                     ,(allocator<char> *)&__begin5);
          std::operator+(&local_b0,&local_d0,":");
          std::__cxx11::to_string(&local_f0,0x180);
          std::operator+(&local_90,&local_b0,&local_f0);
          std::operator+(&local_120,&local_90,": ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_150,&local_120,"Default case should be unreachable!");
          std::logic_error::logic_error(plVar11,(string *)&local_150);
          __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        pMVar7 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSimplePortListSyntax>
                           (&this_00->super_SyntaxNode);
        direction = SemanticFacts::getDirection((pMVar7->direction).kind);
        __begin5.index = 0;
        sVar3 = (pMVar7->ports).elements.size_;
        __begin5.list = &pMVar7->ports;
        for (; (__begin5.list != &pMVar7->ports || (__begin5.index != sVar3 + 1 >> 1));
            __begin5.index = __begin5.index + 1) {
          pSVar8 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
                    iterator_base<slang::syntax::ModportPortSyntax_*>::operator*(&__begin5)->
                    super_SyntaxNode;
          if (pSVar8->kind == ModportExplicitPort) {
            syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::ModportExplicitPortSyntax>
                                  (pSVar8);
            this_01 = ModportPortSymbol::fromSyntax(context,direction,syntax_02);
          }
          else {
            if (pSVar8->kind != ModportNamedPort) {
              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                         ,&local_171);
              std::operator+(&local_b0,&local_d0,":");
              std::__cxx11::to_string(&local_f0,0x156);
              std::operator+(&local_90,&local_b0,&local_f0);
              std::operator+(&local_120,&local_90,": ");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_150,&local_120,"Default case should be unreachable!");
              std::logic_error::logic_error(plVar11,(string *)&local_150);
              __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            pMVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ModportNamedPortSyntax>(pSVar8);
            this_01 = ModportPortSymbol::fromSyntax(context,direction,pMVar9);
          }
          syntax_00.data_ =
               (pMVar7->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
          syntax_00.size_ =
               (pMVar7->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
          Symbol::setAttributes((Symbol *)this_01,&modport->super_Scope,syntax_00);
          Scope::addMember(&modport->super_Scope,(Symbol *)this_01);
        }
      }
    }
  }
  return;
}

Assistant:

void ModportSymbol::fromSyntax(const ASTContext& context, const ModportDeclarationSyntax& syntax,
                               SmallVectorBase<const ModportSymbol*>& results) {
    auto& comp = context.getCompilation();
    for (auto item : syntax.items) {
        auto modport = comp.emplace<ModportSymbol>(comp, item->name.valueText(),
                                                   item->name.location());
        modport->setSyntax(*item);
        modport->setAttributes(*context.scope, syntax.attributes);
        results.push_back(modport);

        for (auto port : item->ports->ports) {
            switch (port->kind) {
                case SyntaxKind::ModportSimplePortList: {
                    auto& portList = port->as<ModportSimplePortListSyntax>();
                    auto direction = SemanticFacts::getDirection(portList.direction.kind);
                    for (auto simplePort : portList.ports) {
                        switch (simplePort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction, simplePort->as<ModportNamedPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            case SyntaxKind::ModportExplicitPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction,
                                    simplePort->as<ModportExplicitPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            default:
                                ASSUME_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportSubroutinePortList: {
                    auto& portList = port->as<ModportSubroutinePortListSyntax>();
                    bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;
                    if (isExport)
                        modport->hasExports = true;

                    for (auto subPort : portList.ports) {
                        switch (subPort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    context, subPort->as<ModportNamedPortSyntax>(), isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            case SyntaxKind::ModportSubroutinePort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    *context.scope, subPort->as<ModportSubroutinePortSyntax>(),
                                    isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            default:
                                ASSUME_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportClockingPort: {
                    auto& clockingPort = port->as<ModportClockingPortSyntax>();
                    auto& mcs = ModportClockingSymbol::fromSyntax(context, clockingPort);
                    mcs.setAttributes(*modport, clockingPort.attributes);
                    modport->addMember(mcs);
                    break;
                }
                default: {
                    ASSUME_UNREACHABLE;
                }
            }
        }
    }
}